

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

void __thiscall setup::type_entry::load(type_entry *this,istream *is,info *i)

{
  setup_type sVar1;
  uint uVar2;
  logger *plVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 uVar6;
  ostringstream *poVar7;
  char buffer [1];
  logger local_1b0;
  
  util::encoded_string::load(is,&this->name,i->codepage,(bitset<256UL> *)0x0);
  util::encoded_string::load(is,&this->description,i->codepage,(bitset<256UL> *)0x0);
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->languages,i->codepage,(bitset<256UL> *)0x0);
  }
  uVar2 = (i->version).value;
  if ((uVar2 < 0x4000000) &&
     ((uVar2 < 0x1031800 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    (this->check)._M_string_length = 0;
    *(this->check)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->check,i->codepage,(bitset<256UL> *)0x0);
  }
  windows_version_range::load(&this->winver,is,&i->version);
  std::istream::read((char *)is,(long)&local_1b0);
  bVar5 = (bool)((undefined1)local_1b0.level & Info);
  uVar6 = (undefined1)local_1b0.level & 0xfe;
  if ((local_1b0.level & Info) == Debug) {
    uVar6 = (undefined1)local_1b0.level;
  }
  if (uVar6 != Debug) {
    local_1b0.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.buffer,"Unexpected ",0xb);
    plVar3 = logger::operator<<(&local_1b0,
                                &enum_names<setup::(anonymous_namespace)::type_flags_Enum_>::name);
    poVar7 = &plVar3->buffer;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," flags: ",8);
    *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) =
         *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) =
         *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) & 0xffffffb5 | 2;
    logger::~logger(&local_1b0);
  }
  this->custom_type = bVar5;
  uVar2 = (i->version).value;
  if (uVar2 < 0x4000300) {
    this->type = User;
  }
  else {
    std::istream::read((char *)is,(long)&local_1b0);
    if ((ulong)(byte)(undefined1)local_1b0.level < 4) {
      sVar1 = *(setup_type *)
               ("[expand 32-byte k" + (ulong)(byte)(undefined1)local_1b0.level * 4 + 0x11);
    }
    else {
      local_1b0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.buffer,"Unexpected ",0xb);
      plVar3 = logger::operator<<(&local_1b0,&enum_names<setup::type_entry::setup_type>::name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar3->buffer," value: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar3->buffer);
      logger::~logger(&local_1b0);
      sVar1 = User;
    }
    this->type = sVar1;
    uVar2 = (i->version).value;
  }
  if (uVar2 < 0x4000000) {
    std::istream::read((char *)is,(long)&local_1b0);
    uVar4 = (ulong)local_1b0.level;
  }
  else {
    std::istream::read((char *)is,(long)&local_1b0);
    uVar4 = CONCAT44(local_1b0._4_4_,local_1b0.level);
  }
  this->size = uVar4;
  return;
}

Assistant:

void type_entry::load(std::istream & is, const info & i) {
	
	USE_FLAG_NAMES(setup::type_flags)
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	winver.load(is, i.version);
	
	type_flags options = stored_flags<stored_type_flags>(is).get();
	custom_type = ((options & CustomSetupType) != 0);
	
	if(i.version >= INNO_VERSION(4, 0, 3)) {
		type = stored_enum<stored_setup_type>(is).get();
	} else {
		type = User;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		size = util::load<boost::uint64_t>(is);
	} else {
		size = util::load<boost::uint32_t>(is);
	}
}